

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_8::DiskHandle::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,DiskHandle *this)

{
  char *__s;
  long lVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  Array<kj::ReadableDirectory::Entry> *pAVar4;
  int iVar5;
  int iVar6;
  Type TVar7;
  __off_t _Var8;
  int *piVar9;
  dirent *pdVar10;
  size_t size;
  ulong uVar11;
  undefined4 extraout_var;
  ArrayDisposer *pAVar12;
  size_t sVar13;
  RemoveConst<kj::ReadableDirectory::Entry> *pRVar14;
  Vector<kj::ReadableDirectory::Entry> entries;
  Fault f_3;
  Fault f_4;
  stat stats;
  Vector<kj::ReadableDirectory::Entry> local_128;
  DIR *local_100;
  Fault local_f8;
  String SStack_f0;
  Fault local_d8;
  Array<kj::ReadableDirectory::Entry> *local_d0;
  undefined1 local_c8 [16];
  size_t local_b8;
  mode_t local_b0;
  __uid_t _Stack_ac;
  
  do {
    _Var8 = lseek((this->fd).fd,0,0);
    if (-1 < _Var8) goto LAB_00217e7c;
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 != 0) {
    local_128.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    _::Debug::Fault::init
              ((Fault *)&local_128,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_128);
  }
LAB_00217e7c:
  do {
    iVar5 = dup((this->fd).fd);
    if (-1 < iVar5) goto LAB_00217e9e;
    iVar6 = _::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_128.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    _::Debug::Fault::init
              ((Fault *)&local_128,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_128);
  }
LAB_00217e9e:
  local_d0 = __return_storage_ptr__;
  local_100 = fdopendir(iVar5);
  if (local_100 == (DIR *)0x0) {
    close(iVar5);
    __errno_location();
    local_128.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    _::Debug::Fault::init
              ((Fault *)&local_128,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_128);
  }
  local_128.builder.ptr = (Entry *)0x0;
  local_128.builder.pos = (Entry *)0x0;
  local_128.builder.endPtr = (Entry *)0x0;
  piVar9 = __errno_location();
LAB_00217ed8:
  do {
    while( true ) {
      *piVar9 = 0;
      pdVar10 = readdir(local_100);
      pAVar4 = local_d0;
      if (pdVar10 == (dirent *)0x0) {
        if (*piVar9 != 0) {
          local_f8.exception = (Exception *)0x0;
          local_c8._0_8_ = 0;
          local_c8._8_8_ = 0;
          _::Debug::Fault::init
                    (&local_f8,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          _::Debug::Fault::fatal(&local_f8);
        }
        pRVar14 = local_128.builder.pos;
        if (local_128.builder.pos != local_128.builder.endPtr) {
          Vector<kj::ReadableDirectory::Entry>::setCapacity
                    (&local_128,(long)local_128.builder.pos - (long)local_128.builder.ptr >> 5);
          pRVar14 = local_128.builder.pos;
        }
        pEVar2 = local_128.builder.ptr;
        uVar11 = (long)pRVar14 - (long)local_128.builder.ptr >> 5;
        pAVar4->ptr = local_128.builder.ptr;
        pAVar4->size_ = uVar11;
        pAVar4->disposer = local_128.builder.disposer;
        local_128.builder.ptr = (Entry *)0x0;
        local_128.builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
        local_128.builder.endPtr = (Entry *)0x0;
        if (pRVar14 != pEVar2) {
          lVar1 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<kj::ReadableDirectory::Entry*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pEVar2,pRVar14,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<kj::ReadableDirectory::Entry*,__gnu_cxx::__ops::_Iter_less_iter>
                    (pEVar2,pRVar14);
          pEVar3 = local_128.builder.endPtr;
          pRVar14 = local_128.builder.pos;
          pEVar2 = local_128.builder.ptr;
          if (local_128.builder.ptr != (Entry *)0x0) {
            local_128.builder.ptr = (Entry *)0x0;
            local_128.builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
            local_128.builder.endPtr = (Entry *)0x0;
            (**(local_128.builder.disposer)->_vptr_ArrayDisposer)
                      (local_128.builder.disposer,pEVar2,0x20,(long)pRVar14 - (long)pEVar2 >> 5,
                       (long)pEVar3 - (long)pEVar2 >> 5,
                       ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry,_false>::destruct);
          }
        }
        iVar5 = closedir(local_100);
        return (Array<kj::ReadableDirectory::Entry> *)CONCAT44(extraout_var,iVar5);
      }
      __s = pdVar10->d_name;
      size = strlen(__s);
      if (size == 2) break;
      if (size != 1) goto LAB_00217f25;
      if (*__s != '.') goto LAB_00217f3f;
    }
  } while (*(short *)__s == 0x2e2e);
  goto LAB_00217f3f;
LAB_00217f25:
  if ((size + 1 < 9) || (*(long *)__s != 0x2e706d742d6a6b2e)) {
LAB_00217f3f:
    if (pdVar10->d_type == 0) {
      do {
        iVar5 = fstatat((this->fd).fd,__s,(stat *)local_c8,0x100);
        if (-1 < iVar5) goto LAB_00217fec;
        iVar5 = _::Debug::getOsErrorNumber(false);
      } while (iVar5 == -1);
      if (iVar5 != 0) {
        local_d8.exception = (Exception *)0x0;
        local_f8.exception = (Exception *)0x0;
        SStack_f0.content.ptr = (char *)0x0;
        _::Debug::Fault::init
                  (&local_d8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::fatal(&local_d8);
      }
LAB_00217fec:
      TVar7 = modeToType(local_b0);
      local_f8.exception._0_4_ = TVar7;
      heapString(&SStack_f0,__s,size);
      if (local_128.builder.pos == local_128.builder.endPtr) {
        sVar13 = (long)local_128.builder.pos - (long)local_128.builder.ptr >> 4;
        if (local_128.builder.pos == local_128.builder.ptr) {
          sVar13 = 4;
        }
        Vector<kj::ReadableDirectory::Entry>::setCapacity(&local_128,sVar13);
      }
      (local_128.builder.pos)->type = (Type)local_f8.exception;
      ((local_128.builder.pos)->name).content.ptr = SStack_f0.content.ptr;
      ((local_128.builder.pos)->name).content.size_ = SStack_f0.content.size_;
      pAVar12 = SStack_f0.content.disposer;
    }
    else {
      TVar7 = modeToType((uint)pdVar10->d_type << 0xc);
      local_c8._0_4_ = TVar7;
      heapString((String *)(local_c8 + 8),__s,size);
      if (local_128.builder.pos == local_128.builder.endPtr) {
        sVar13 = (long)local_128.builder.pos - (long)local_128.builder.ptr >> 4;
        if (local_128.builder.pos == local_128.builder.ptr) {
          sVar13 = 4;
        }
        Vector<kj::ReadableDirectory::Entry>::setCapacity(&local_128,sVar13);
      }
      (local_128.builder.pos)->type = local_c8._0_4_;
      ((local_128.builder.pos)->name).content.ptr = (char *)local_c8._8_8_;
      ((local_128.builder.pos)->name).content.size_ = local_b8;
      pAVar12 = (ArrayDisposer *)CONCAT44(_Stack_ac,local_b0);
    }
    ((local_128.builder.pos)->name).content.disposer = pAVar12;
    local_128.builder.pos = local_128.builder.pos + 1;
  }
  goto LAB_00217ed8;
}

Assistant:

Array<ReadableDirectory::Entry> listEntries() const {
    return list(true, [](StringPtr name, FsNode::Type type) {
      return ReadableDirectory::Entry { type, heapString(name), };
    });
  }